

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::TestEventRepeater::~TestEventRepeater(TestEventRepeater *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  
  (this->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_00185ce8;
  ppTVar2 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar2 != ppTVar1) {
    do {
      if (*ppTVar2 != (TestEventListener *)0x0) {
        (*(*ppTVar2)->_vptr_TestEventListener[1])();
      }
      ppTVar2 = ppTVar2 + 1;
    } while (ppTVar2 != ppTVar1);
    ppTVar2 = (this->listeners_).
              super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->listeners_).
                                  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
    return;
  }
  return;
}

Assistant:

TestEventRepeater::~TestEventRepeater() {
  ForEach(listeners_, Delete<TestEventListener>);
}